

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::Tau(BaseRockSample *this)

{
  OBS_TYPE in_RCX;
  ACT_TYPE in_EDX;
  Belief *in_RSI;
  
  Tau((BaseRockSample *)
      &this[-1].transition_probabilities_.
       super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

Belief* BaseRockSample::Tau(const Belief* belief, ACT_TYPE action,
	OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		RockSampleState* state = static_cast<RockSampleState*>(particle);
		int id = NextState(state->state_id, action);

		if (id == NumStates() - 1)
			continue; // ignore terminal state

		const RockSampleState& next = *(states_[id]);
		double p = state->weight * ObsProb(obs, next, action);
		probs[id] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	if (new_particles.size() == 0) {
		cout << *belief << endl;
		exit(0);
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}